

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O3

bool __thiscall libcellml::Annotator::assignIds(Annotator *this,CellmlElementType type)

{
  int iVar1;
  element_type *this_00;
  int iVar2;
  LoggerImpl *pLVar3;
  size_t sVar4;
  AnnotatorImpl *pAVar5;
  ulong uVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  bool bVar7;
  shared_ptr<libcellml::Model> model;
  ModelPtr local_58;
  pointer local_48;
  ComponentEntity local_40;
  
  pLVar3 = Logger::pFunc(&this->super_Logger);
  this_01._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       pLVar3[1].mMessages.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  local_58.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       this_01._M_pi;
  if (this_01._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_001d4c48:
    this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_001d4c4b:
    local_58.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    iVar2 = (this_01._M_pi)->_M_use_count;
    do {
      if (iVar2 == 0) {
        local_58.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        goto LAB_001d4c48;
      }
      LOCK();
      iVar1 = (this_01._M_pi)->_M_use_count;
      bVar7 = iVar2 == iVar1;
      if (bVar7) {
        (this_01._M_pi)->_M_use_count = iVar2 + 1;
        iVar1 = iVar2;
      }
      iVar2 = iVar1;
      UNLOCK();
    } while (!bVar7);
    if (this_01._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001d4c48;
    if ((this_01._M_pi)->_M_use_count == 0) goto LAB_001d4c4b;
    this_00 = (element_type *)
              pLVar3[1].mMessages.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    local_58.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
    if (this_00 != (element_type *)0x0) {
      pLVar3 = Logger::pFunc(&this->super_Logger);
      local_48 = pLVar3[1].mMessages.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
      switch(type) {
      case COMPONENT:
      case COMPONENT_REF:
      case CONNECTION:
      case MAP_VARIABLES:
      case RESET:
      case RESET_VALUE:
      case TEST_VALUE:
      case VARIABLE:
        for (uVar6 = 0; sVar4 = ComponentEntity::componentCount((ComponentEntity *)this_00),
            uVar6 < sVar4; uVar6 = uVar6 + 1) {
          pAVar5 = (AnnotatorImpl *)Logger::pFunc(&this->super_Logger);
          ComponentEntity::component(&local_40,(size_t)this_00);
          AnnotatorImpl::doSetComponentTreeTypeIds(pAVar5,(ComponentPtr *)&local_40,type,false);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
          }
        }
        break;
      case ENCAPSULATION:
        pAVar5 = (AnnotatorImpl *)Logger::pFunc(&this->super_Logger);
        AnnotatorImpl::doSetEncapsulationIds(pAVar5);
        break;
      case IMPORT:
        pAVar5 = (AnnotatorImpl *)Logger::pFunc(&this->super_Logger);
        AnnotatorImpl::doSetImportSourceIds(pAVar5);
        break;
      case MODEL:
        pAVar5 = (AnnotatorImpl *)Logger::pFunc(&this->super_Logger);
        AnnotatorImpl::doSetModelIds(pAVar5);
        break;
      case UNIT:
        pAVar5 = (AnnotatorImpl *)Logger::pFunc(&this->super_Logger);
        AnnotatorImpl::doSetUnitsItemIds(pAVar5);
        break;
      case UNITS:
        pAVar5 = (AnnotatorImpl *)Logger::pFunc(&this->super_Logger);
        AnnotatorImpl::doSetUnitsIds(pAVar5);
      }
      setModel(this,&local_58);
      pLVar3 = Logger::pFunc(&this->super_Logger);
      bVar7 = local_48 <
              pLVar3[1].mMessages.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
      this_01._M_pi =
           local_58.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      goto LAB_001d4c66;
    }
  }
  pAVar5 = (AnnotatorImpl *)Logger::pFunc(&this->super_Logger);
  AnnotatorImpl::addIssueNoModel(pAVar5);
  bVar7 = false;
LAB_001d4c66:
  if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
  }
  return bVar7;
}

Assistant:

bool Annotator::assignIds(CellmlElementType type)
{
    auto model = pFunc()->mModel.lock();
    if (model == nullptr) {
        pFunc()->addIssueNoModel();
        return false;
    }

    size_t initialSize = pFunc()->idCount();

    switch (type) {
    case CellmlElementType::COMPONENT:
    case CellmlElementType::COMPONENT_REF:
    case CellmlElementType::CONNECTION:
    case CellmlElementType::MAP_VARIABLES:
    case CellmlElementType::RESET:
    case CellmlElementType::RESET_VALUE:
    case CellmlElementType::TEST_VALUE:
    case CellmlElementType::VARIABLE:
        for (size_t index = 0; index < model->componentCount(); ++index) {
            pFunc()->doSetComponentTreeTypeIds(model->component(index), type);
        }
        break;
    case CellmlElementType::ENCAPSULATION:
        pFunc()->doSetEncapsulationIds();
        break;
    case CellmlElementType::IMPORT:
        pFunc()->doSetImportSourceIds();
        break;
    case CellmlElementType::MODEL:
        pFunc()->doSetModelIds();
        break;
    case CellmlElementType::UNIT:
        pFunc()->doSetUnitsItemIds();
        break;
    case CellmlElementType::UNITS:
        pFunc()->doSetUnitsIds();
        break;
    case CellmlElementType::MATH:
    default: /* case CellmlElementType::UNDEFINED */
        break;
    }

    setModel(model);

    return pFunc()->idCount() > initialSize;
}